

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_image * nk_subimage_id(int id,unsigned_short w,unsigned_short h,nk_rect r)

{
  unsigned_short in_CX;
  unsigned_short in_DX;
  int in_ESI;
  nk_image *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  nk_image *s;
  nk_image *pnVar1;
  float local_10;
  float fStack_c;
  float local_8;
  float fStack_4;
  
  pnVar1 = in_RDI;
  nk_zero(in_RDI,(nk_size)in_RDI);
  (in_RDI->handle).id = in_ESI;
  in_RDI->w = in_DX;
  in_RDI->h = in_CX;
  local_10 = (float)in_XMM0_Qa;
  in_RDI->region[0] = (unsigned_short)(int)local_10;
  fStack_c = (float)((ulong)in_XMM0_Qa >> 0x20);
  in_RDI->region[1] = (unsigned_short)(int)fStack_c;
  local_8 = (float)in_XMM1_Qa;
  in_RDI->region[2] = (unsigned_short)(int)local_8;
  fStack_4 = (float)((ulong)in_XMM1_Qa >> 0x20);
  in_RDI->region[3] = (unsigned_short)(int)fStack_4;
  return pnVar1;
}

Assistant:

NK_API struct nk_image
nk_subimage_id(int id, unsigned short w, unsigned short h, struct nk_rect r)
{
struct nk_image s;
nk_zero(&s, sizeof(s));
s.handle.id = id;
s.w = w; s.h = h;
s.region[0] = (unsigned short)r.x;
s.region[1] = (unsigned short)r.y;
s.region[2] = (unsigned short)r.w;
s.region[3] = (unsigned short)r.h;
return s;
}